

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLHANGINGMAN_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000488;
  double *in_stack_00000490;
  double *in_stack_00000498;
  double *in_stack_000004a0;
  int in_stack_000004ac;
  int in_stack_000004b0;
  int *in_stack_000004c0;
  int *in_stack_000004c8;
  int *in_stack_000004d0;
  
  TVar1 = TA_CDLHANGINGMAN(in_stack_000004b0,in_stack_000004ac,in_stack_000004a0,in_stack_00000498,
                           in_stack_00000490,in_stack_00000488,in_stack_000004c0,in_stack_000004c8,
                           in_stack_000004d0);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLHANGINGMAN_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLHANGINGMAN(
/* Generated */                       startIdx,
/* Generated */                       endIdx,
/* Generated */                       params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                       params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                       params->in[0].data.inPrice.low, /* inLow */
/* Generated */                       params->in[0].data.inPrice.close, /* inClose */
/* Generated */                       outBegIdx, 
/* Generated */                       outNBElement, 
/* Generated */                       params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }